

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>>::
emplace_back<slang::ast::ValueSymbol*,slang::ast::Symbol_const*&>
          (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *this,
          ValueSymbol **args,Symbol **args_1)

{
  ulong uVar1;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *p;
  undefined8 uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *pSVar5;
  ulong uVar6;
  SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *__src;
  long lVar7;
  long lVar8;
  
  lVar7 = *(long *)this;
  lVar8 = *(long *)(this + 8);
  __src = (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)
          (lVar8 * 0x10 + lVar7);
  if (lVar8 != *(long *)(this + 0x10)) {
    *(ValueSymbol **)__src = *args;
    *(Symbol **)(__src + 8) = *args_1;
    *(long *)(this + 8) = lVar8 + 1;
    return (reference)(lVar7 + (lVar8 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar6 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar6 < uVar1 * 2) {
    uVar6 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar6 = 0x7ffffffffffffff;
  }
  lVar8 = (long)__src - *(long *)this;
  puVar3 = (undefined8 *)operator_new(uVar6 << 4);
  *(ValueSymbol **)((long)puVar3 + lVar8) = *args;
  *(Symbol **)((long)puVar3 + lVar8 + 8) = *args_1;
  p = *(SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> **)this;
  lVar7 = *(long *)(this + 8);
  pSVar5 = p;
  puVar4 = puVar3;
  if (p + (lVar7 * 0x10 - (long)__src) ==
      (SmallVectorBase<std::pair<slang::ast::Symbol*,slang::ast::Symbol_const*>> *)0x0) {
    if (lVar7 != 0) {
      do {
        uVar2 = *(undefined8 *)(pSVar5 + 8);
        *puVar4 = *(undefined8 *)pSVar5;
        puVar4[1] = uVar2;
        pSVar5 = pSVar5 + 0x10;
        puVar4 = puVar4 + 2;
      } while (pSVar5 != __src);
    }
  }
  else {
    for (; pSVar5 != __src; pSVar5 = pSVar5 + 0x10) {
      uVar2 = *(undefined8 *)(pSVar5 + 8);
      *puVar4 = *(undefined8 *)pSVar5;
      puVar4[1] = uVar2;
      puVar4 = puVar4 + 2;
    }
    memcpy((void *)((long)puVar3 + lVar8 + 0x10),__src,
           ((ulong)(p + (lVar7 * 0x10 - (long)__src) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
    lVar7 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar7 + 1;
  *(ulong *)(this + 0x10) = uVar6;
  *(undefined8 **)this = puVar3;
  return (reference)((long)puVar3 + lVar8);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }